

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::Load(Cluster *this,longlong *pos,long *len)

{
  int iVar1;
  longlong lVar2;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  longlong unknown_size_1;
  longlong size_1;
  longlong id;
  longlong result_1;
  longlong cluster_stop;
  bool bBlock;
  longlong new_pos;
  longlong timecode;
  longlong unknown_size;
  longlong size;
  longlong id_;
  longlong result;
  longlong cluster_size;
  int status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  IMkvReader *local_b8;
  long *in_stack_ffffffffffffff58;
  long *in_stack_ffffffffffffff60;
  IMkvReader *in_stack_ffffffffffffff68;
  longlong in_stack_ffffffffffffff70;
  IMkvReader *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar3;
  IMkvReader *in_stack_ffffffffffffff88;
  IMkvReader *pReader_00;
  longlong local_70;
  long local_48;
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long local_8;
  
  if (*in_RDI == 0) {
    local_8 = -1;
  }
  else if (in_RDI[5] < 0) {
    if ((in_RDI[3] == in_RDI[1]) && (in_RDI[4] < 0)) {
      local_28 = *(long **)*in_RDI;
      local_20 = in_RDX;
      local_18 = in_RSI;
      iVar1 = (**(code **)(*local_28 + 8))(local_28,&local_30,&local_38);
      if (iVar1 < 0) {
        local_8 = (long)iVar1;
      }
      else if ((local_30 < 0) || ((local_38 <= local_30 && (in_RDI[3] <= local_30)))) {
        *local_18 = in_RDI[3];
        local_48 = -1;
        if (local_38 < *local_18 + 1) {
          *local_20 = 1;
          local_8 = -3;
        }
        else {
          local_8 = GetUIntLength(in_stack_ffffffffffffff68,(longlong)in_stack_ffffffffffffff60,
                                  in_stack_ffffffffffffff58);
          if (-1 < local_8) {
            if (local_8 < 1) {
              if (local_38 < *local_18 + *local_20) {
                local_8 = -3;
              }
              else {
                local_8 = ReadID(in_stack_ffffffffffffff88,
                                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                 (long *)in_stack_ffffffffffffff78);
                if (-1 < local_8) {
                  if (local_8 == 0x1f43b675) {
                    *local_18 = *local_20 + *local_18;
                    if (local_38 < *local_18 + 1) {
                      *local_20 = 1;
                      local_8 = -3;
                    }
                    else {
                      local_8 = GetUIntLength(in_stack_ffffffffffffff68,
                                              (longlong)in_stack_ffffffffffffff60,
                                              in_stack_ffffffffffffff58);
                      if (-1 < local_8) {
                        if (local_8 < 1) {
                          if (local_38 < *local_18 + *local_20) {
                            local_8 = -3;
                          }
                          else {
                            lVar2 = ReadUInt(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                             (long *)in_stack_ffffffffffffff68);
                            if (lVar2 < 0) {
                              local_8 = -1;
                            }
                            else if (lVar2 == 0) {
                              local_8 = -2;
                            }
                            else {
                              *local_18 = *local_20 + *local_18;
                              if (lVar2 != (1L << ((char)*local_20 * '\a' & 0x3fU)) + -1) {
                                local_48 = lVar2;
                              }
                              local_70 = -1;
                              pReader_00 = (IMkvReader *)0xffffffffffffffff;
                              bVar3 = 0;
                              if (local_48 < 0) {
                                local_b8 = (IMkvReader *)0xffffffffffffffff;
                              }
                              else {
                                local_b8 = (IMkvReader *)(*local_18 + local_48);
                              }
                              do {
                                do {
                                  if ((-1 < (long)local_b8) && ((long)local_b8 <= *local_18)) {
LAB_00186df8:
                                    if ((-1 < (long)local_b8) && ((long)local_b8 < *local_18)) {
                                      return -2;
                                    }
                                    if (local_70 < 0) {
                                      return -2;
                                    }
                                    if ((bVar3 & 1) == 0) {
                                      return -2;
                                    }
                                    in_RDI[3] = (long)pReader_00;
                                    in_RDI[5] = local_70;
                                    if (-1 < local_48) {
                                      in_RDI[4] = (long)local_b8 - in_RDI[1];
                                    }
                                    return 0;
                                  }
                                  if (local_38 < *local_18 + 1) {
                                    *local_20 = 1;
                                    return -3;
                                  }
                                  lVar2 = GetUIntLength(in_stack_ffffffffffffff68,
                                                        (longlong)in_stack_ffffffffffffff60,
                                                        in_stack_ffffffffffffff58);
                                  if (lVar2 < 0) {
                                    return lVar2;
                                  }
                                  if (0 < lVar2) {
                                    return -3;
                                  }
                                  if ((-1 < (long)local_b8) &&
                                     ((long)local_b8 < *local_18 + *local_20)) {
                                    return -2;
                                  }
                                  if (local_38 < *local_18 + *local_20) {
                                    return -3;
                                  }
                                  in_stack_ffffffffffffff68 =
                                       (IMkvReader *)
                                       ReadID(pReader_00,CONCAT17(bVar3,in_stack_ffffffffffffff80),
                                              (long *)local_b8);
                                  if ((long)in_stack_ffffffffffffff68 < 0) {
                                    return (long)in_stack_ffffffffffffff68;
                                  }
                                  if (in_stack_ffffffffffffff68 == (IMkvReader *)0x0) {
                                    return -2;
                                  }
                                  if ((in_stack_ffffffffffffff68 == (IMkvReader *)0x1f43b675) ||
                                     (in_stack_ffffffffffffff68 == (IMkvReader *)0x1c53bb6b))
                                  goto LAB_00186df8;
                                  *local_18 = *local_20 + *local_18;
                                  if (local_38 < *local_18 + 1) {
                                    *local_20 = 1;
                                    return -3;
                                  }
                                  lVar2 = GetUIntLength(in_stack_ffffffffffffff68,
                                                        (longlong)in_stack_ffffffffffffff60,
                                                        in_stack_ffffffffffffff58);
                                  if (lVar2 < 0) {
                                    return lVar2;
                                  }
                                  if (0 < lVar2) {
                                    return -3;
                                  }
                                  if ((-1 < (long)local_b8) &&
                                     ((long)local_b8 < *local_18 + *local_20)) {
                                    return -2;
                                  }
                                  if (local_38 < *local_18 + *local_20) {
                                    return -3;
                                  }
                                  in_stack_ffffffffffffff60 =
                                       (long *)ReadUInt(local_b8,lVar2,
                                                        (long *)in_stack_ffffffffffffff68);
                                  if ((long)in_stack_ffffffffffffff60 < 0) {
                                    return (long)in_stack_ffffffffffffff60;
                                  }
                                  in_stack_ffffffffffffff58 =
                                       (long *)((1L << ((char)*local_20 * '\a' & 0x3fU)) + -1);
                                  if (in_stack_ffffffffffffff60 == in_stack_ffffffffffffff58) {
                                    return -2;
                                  }
                                  *local_18 = *local_20 + *local_18;
                                  if ((-1 < (long)local_b8) && ((long)local_b8 < *local_18)) {
                                    return -2;
                                  }
                                } while (in_stack_ffffffffffffff60 == (long *)0x0);
                                if ((-1 < (long)local_b8) &&
                                   ((long)local_b8 < (long)in_stack_ffffffffffffff60 + *local_18)) {
                                  return -2;
                                }
                                if (in_stack_ffffffffffffff68 == (IMkvReader *)0xe7) {
                                  *local_20 = (long)in_stack_ffffffffffffff60;
                                  if (local_38 < (long)in_stack_ffffffffffffff60 + *local_18) {
                                    return -3;
                                  }
                                  local_70 = UnserializeUInt(local_b8,lVar2,0xe7);
                                  if (local_70 < 0) {
                                    return local_70;
                                  }
                                  pReader_00 = (IMkvReader *)
                                               ((long)in_stack_ffffffffffffff60 + *local_18);
                                  if ((bVar3 & 1) != 0) goto LAB_00186df8;
                                }
                                else {
                                  if (in_stack_ffffffffffffff68 == (IMkvReader *)0xa0) {
                                    bVar3 = 1;
                                    goto LAB_00186df8;
                                  }
                                  if (in_stack_ffffffffffffff68 == (IMkvReader *)0xa3) {
                                    bVar3 = 1;
                                    goto LAB_00186df8;
                                  }
                                }
                                *local_18 = (long)in_stack_ffffffffffffff60 + *local_18;
                              } while (((long)local_b8 < 0) || (*local_18 <= (long)local_b8));
                              local_8 = -2;
                            }
                          }
                        }
                        else {
                          local_8 = -3;
                        }
                      }
                    }
                  }
                  else {
                    local_8 = -2;
                  }
                }
              }
            }
            else {
              local_8 = -3;
            }
          }
        }
      }
      else {
        local_8 = -2;
      }
    }
    else {
      local_8 = -1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

long Cluster::Load(long long& pos, long& len) const {
  if (m_pSegment == NULL)
    return E_PARSE_FAILED;

  if (m_timecode >= 0)  // at least partially loaded
    return 0;

  if (m_pos != m_element_start || m_element_size >= 0)
    return E_PARSE_FAILED;

  IMkvReader* const pReader = m_pSegment->m_pReader;
  long long total, avail;
  const int status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && (avail > total || m_pos > total))
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  long long cluster_size = -1;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error or underflow
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long id_ = ReadID(pReader, pos, len);

  if (id_ < 0)  // error
    return static_cast<long>(id_);

  if (id_ != libwebm::kMkvCluster)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  // read cluster size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(cluster_size);

  if (size == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size of element

  const long long unknown_size = (1LL << (7 * len)) - 1;

  if (size != unknown_size)
    cluster_size = size;

  // pos points to start of payload
  long long timecode = -1;
  long long new_pos = -1;
  bool bBlock = false;

  long long cluster_stop = (cluster_size < 0) ? -1 : pos + cluster_size;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      break;

    if (id == libwebm::kMkvCues)
      break;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvTimecode) {
      len = static_cast<long>(size);

      if ((pos + size) > avail)
        return E_BUFFER_NOT_FULL;

      timecode = UnserializeUInt(pReader, pos, size);

      if (timecode < 0)  // error (or underflow)
        return static_cast<long>(timecode);

      new_pos = pos + size;

      if (bBlock)
        break;
    } else if (id == libwebm::kMkvBlockGroup) {
      bBlock = true;
      break;
    } else if (id == libwebm::kMkvSimpleBlock) {
      bBlock = true;
      break;
    }

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (cluster_stop >= 0 && pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (timecode < 0)  // no timecode found
    return E_FILE_FORMAT_INVALID;

  if (!bBlock)
    return E_FILE_FORMAT_INVALID;

  m_pos = new_pos;  // designates position just beyond timecode payload
  m_timecode = timecode;  // m_timecode >= 0 means we're partially loaded

  if (cluster_size >= 0)
    m_element_size = cluster_stop - m_element_start;

  return 0;
}